

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad,realtype droptol,int sparsetype)

{
  double dVar1;
  sunindextype *psVar2;
  sunindextype M;
  void *pvVar3;
  SUNMatrix_ID SVar4;
  SUNMatrix p_Var5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  sunindextype N;
  
  if (droptol < 0.0 || 1 < (uint)sparsetype) {
    return (SUNMatrix)0x0;
  }
  SVar4 = SUNMatGetID(Ad);
  if (SVar4 == SUNMATRIX_DENSE) {
    psVar2 = (sunindextype *)Ad->content;
    M = *psVar2;
    N = psVar2[1];
    lVar7 = 0;
    lVar9 = 0;
    if (0 < M) {
      lVar9 = M;
    }
    lVar10 = 0;
    if (0 < N) {
      lVar10 = N;
    }
    for (lVar6 = 0; lVar6 != lVar10; lVar6 = lVar6 + 1) {
      for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
        lVar7 = lVar7 + (ulong)(droptol <
                               ABS(*(double *)(*(long *)(psVar2[4] + lVar6 * 8) + lVar8 * 8)));
      }
    }
    p_Var5 = SUNSparseMatrix(M,N,lVar7,sparsetype);
    if (p_Var5 != (SUNMatrix)0x0) {
      lVar7 = 0;
      lVar6 = 0;
      if (sparsetype == 0) {
        for (; lVar6 != lVar10; lVar6 = lVar6 + 1) {
          pvVar3 = p_Var5->content;
          *(long *)(*(long *)((long)pvVar3 + 0x38) + lVar6 * 8) = lVar7;
          for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
            dVar1 = *(double *)
                     (*(long *)(*(long *)((long)Ad->content + 0x20) + lVar6 * 8) + lVar8 * 8);
            if (droptol < ABS(dVar1)) {
              *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar7 * 8) = lVar8;
              *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar7 * 8) = dVar1;
              lVar7 = lVar7 + 1;
            }
          }
        }
      }
      else {
        for (; N = M, lVar6 != lVar9; lVar6 = lVar6 + 1) {
          pvVar3 = p_Var5->content;
          *(long *)(*(long *)((long)pvVar3 + 0x38) + lVar6 * 8) = lVar7;
          for (lVar8 = 0; lVar10 != lVar8; lVar8 = lVar8 + 1) {
            dVar1 = *(double *)
                     (*(long *)(*(long *)((long)Ad->content + 0x20) + lVar8 * 8) + lVar6 * 8);
            if (droptol < ABS(dVar1)) {
              *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar7 * 8) = lVar8;
              *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar7 * 8) = dVar1;
              lVar7 = lVar7 + 1;
            }
          }
        }
      }
      *(long *)(*(long *)((long)p_Var5->content + 0x38) + N * 8) = lVar7;
      return p_Var5;
    }
  }
  return (SUNMatrix)0x0;
}

Assistant:

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad, realtype droptol, int sparsetype)
{
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  /* check for legal sparsetype, droptol and input matrix type */
  if ( (sparsetype != CSR_MAT) && (sparsetype != CSC_MAT) )
    return NULL;
  if ( droptol < ZERO )
    return NULL;
  if (SUNMatGetID(Ad) != SUNMATRIX_DENSE)
    return NULL;
  
  /* set size of new matrix */
  M = SM_ROWS_D(Ad);
  N = SM_COLUMNS_D(Ad);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j=0; j<N; j++)
    for (i=0; i<M; i++)
      nnz += (SUNRabs(SM_ELEMENT_D(Ad,i,j)) > droptol);
    
  /* allocate sparse matrix */
  As = SUNSparseMatrix(M, N, nnz, sparsetype);
  if (As == NULL)  return NULL;
  
  /* copy nonzeros from Ad into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT) {
    for (j=0; j<N; j++) {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i=0; i<M; i++) {
        if ( SUNRabs(SM_ELEMENT_D(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_D(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  } else {       /* CSR_MAT */
    for (i=0; i<M; i++) {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j=0; j<N; j++) {
        if ( SUNRabs(SM_ELEMENT_D(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_D(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }
    
  return(As);
}